

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O1

void __thiscall
MissingDependencyScannerTest::MissingDependencyScannerTest(MissingDependencyScannerTest *this)

{
  _Rb_tree_header *p_Var1;
  Rule *pRVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Test *this_00;
  bool bVar4;
  int iVar5;
  string err;
  string local_90;
  VirtualFileSystem *local_70;
  Rule *local_68;
  Rule *local_60;
  MissingDependencyTestDelegate *local_58;
  string local_50;
  
  (this->super_Test).failed_ = false;
  (this->super_Test).assertion_failures_ = 0;
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MissingDependencyScannerTest_001fcab8;
  (this->delegate_).super_MissingDependencyScannerDelegate._vptr_MissingDependencyScannerDelegate =
       (_func_int **)&PTR__MissingDependencyScannerDelegate_001fcaf0;
  paVar3 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar3;
  local_58 = &this->delegate_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"generator_rule","");
  (this->generator_rule_).name_._M_dataplus._M_p = (pointer)&(this->generator_rule_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->generator_rule_,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  p_Var1 = &(this->generator_rule_).bindings_._M_t._M_impl.super__Rb_tree_header;
  (this->generator_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->generator_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->generator_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->generator_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->generator_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar3;
  local_60 = &this->generator_rule_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"compile_rule","");
  pRVar2 = &this->compile_rule_;
  (this->compile_rule_).name_._M_dataplus._M_p = (pointer)&(this->compile_rule_).name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pRVar2,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  p_Var1 = &(this->compile_rule_).bindings_._M_t._M_impl.super__Rb_tree_header;
  (this->compile_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->compile_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->compile_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->compile_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->compile_rule_).bindings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = pRVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  (this->deps_log_).needs_recompaction_ = false;
  (this->deps_log_).file_ = (FILE *)0x0;
  (this->deps_log_).file_path_._M_dataplus._M_p = (pointer)&(this->deps_log_).file_path_.field_2;
  (this->deps_log_).file_path_._M_string_length = 0;
  (this->deps_log_).file_path_.field_2._M_local_buf[0] = '\0';
  (this->deps_log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deps_log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deps_log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->deps_log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deps_log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deps_log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  State::State(&this->state_);
  local_70 = &this->filesystem_;
  (this->filesystem_).super_DiskInterface.super_FileReader._vptr_FileReader =
       (_func_int **)&PTR__VirtualFileSystem_001fd228;
  p_Var1 = &(this->filesystem_).files_._M_t._M_impl.super__Rb_tree_header;
  (this->filesystem_).files_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->filesystem_).files_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->filesystem_).directories_made_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filesystem_).directories_made_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filesystem_).directories_made_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filesystem_).files_read_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filesystem_).files_read_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filesystem_).files_read_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filesystem_).files_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->filesystem_).files_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->filesystem_).files_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->filesystem_).files_removed_._M_t._M_impl.super__Rb_tree_header;
  (this->filesystem_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->filesystem_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->filesystem_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->filesystem_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->filesystem_).files_removed_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->filesystem_).files_created_._M_t._M_impl.super__Rb_tree_header;
  (this->filesystem_).files_created_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->filesystem_).files_created_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->filesystem_).files_created_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->filesystem_).files_created_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->filesystem_).files_created_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->filesystem_).now_ = 1;
  MissingDependencyScanner::MissingDependencyScanner
            (&this->scanner_,&(this->delegate_).super_MissingDependencyScannerDelegate,
             &this->deps_log_,&this->state_,&local_70->super_DiskInterface);
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar3;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"MissingDepTest-tempdepslog","");
  DepsLog::OpenForWrite(&this->deps_log_,&local_50,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_00 = g_current_test;
  iVar5 = std::__cxx11::string::compare((char *)&local_90);
  bVar4 = testing::Test::Check
                    (this_00,iVar5 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                     ,0x24,"\"\" == err");
  if (!bVar4) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

MissingDependencyScannerTest()
      : generator_rule_("generator_rule"), compile_rule_("compile_rule"),
        scanner_(&delegate_, &deps_log_, &state_, &filesystem_) {
    std::string err;
    deps_log_.OpenForWrite(kTestDepsLogFilename, &err);
    ASSERT_EQ("", err);
  }